

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPersistentManifold.cpp
# Opt level: O3

void __thiscall
btPersistentManifold::refreshContactPoints
          (btPersistentManifold *this,btTransform *trA,btTransform *trB)

{
  float fVar1;
  undefined8 uVar2;
  int iVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  float *pfVar8;
  btManifoldPoint *pbVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  iVar3 = this->m_cachedPoints;
  uVar10 = (ulong)iVar3;
  if (0 < (long)uVar10) {
    uVar7 = uVar10 + 1;
    pfVar8 = (float *)((long)this + uVar10 * 0xc0 + -0xb8);
    do {
      fVar15 = *pfVar8;
      fVar1 = pfVar8[1];
      fVar13 = pfVar8[2];
      uVar2 = *(undefined8 *)(trA->m_origin).m_floats;
      fVar12 = (float)uVar2 +
               (trA->m_basis).m_el[0].m_floats[2] * fVar13 +
               (trA->m_basis).m_el[0].m_floats[0] * fVar15 +
               (trA->m_basis).m_el[0].m_floats[1] * fVar1;
      fVar14 = (float)((ulong)uVar2 >> 0x20) +
               (trA->m_basis).m_el[1].m_floats[2] * fVar13 +
               (trA->m_basis).m_el[1].m_floats[0] * fVar15 +
               (trA->m_basis).m_el[1].m_floats[1] * fVar1;
      fVar11 = (trA->m_basis).m_el[2].m_floats[2] * fVar13 +
               (trA->m_basis).m_el[2].m_floats[0] * fVar15 +
               (trA->m_basis).m_el[2].m_floats[1] * fVar1 + (trA->m_origin).m_floats[2];
      auVar5._4_4_ = fVar14;
      auVar5._0_4_ = fVar12;
      auVar5._8_4_ = fVar11;
      auVar5._12_4_ = 0;
      *(undefined1 (*) [16])(pfVar8 + 0xc) = auVar5;
      fVar15 = pfVar8[4];
      fVar1 = pfVar8[5];
      fVar13 = pfVar8[6];
      uVar2 = *(undefined8 *)(trB->m_origin).m_floats;
      fVar16 = (float)uVar2 +
               (trB->m_basis).m_el[0].m_floats[2] * fVar13 +
               (trB->m_basis).m_el[0].m_floats[0] * fVar15 +
               (trB->m_basis).m_el[0].m_floats[1] * fVar1;
      fVar17 = (float)((ulong)uVar2 >> 0x20) +
               (trB->m_basis).m_el[1].m_floats[2] * fVar13 +
               (trB->m_basis).m_el[1].m_floats[0] * fVar15 +
               (trB->m_basis).m_el[1].m_floats[1] * fVar1;
      fVar15 = (trB->m_basis).m_el[2].m_floats[2] * fVar13 +
               (trB->m_basis).m_el[2].m_floats[0] * fVar15 +
               (trB->m_basis).m_el[2].m_floats[1] * fVar1 + (trB->m_origin).m_floats[2];
      auVar6._4_4_ = fVar17;
      auVar6._0_4_ = fVar16;
      auVar6._8_4_ = fVar15;
      auVar6._12_4_ = 0;
      *(undefined1 (*) [16])(pfVar8 + 8) = auVar6;
      pfVar8[0x14] = (fVar11 - fVar15) * pfVar8[0x12] +
                     pfVar8[0x10] * (fVar12 - fVar16) + (fVar14 - fVar17) * pfVar8[0x11];
      pfVar8[0x26] = (float)((int)pfVar8[0x26] + 1);
      uVar7 = uVar7 - 1;
      pfVar8 = pfVar8 + -0x30;
    } while (1 < uVar7);
    if (0 < iVar3) {
      pbVar9 = (btManifoldPoint *)((long)this + uVar10 * 0xc0 + -0xb8);
      do {
        fVar15 = pbVar9->m_distance1;
        fVar1 = this->m_contactBreakingThreshold;
        if ((fVar1 < fVar15) ||
           (fVar13 = (pbVar9->m_positionWorldOnB).m_floats[0] -
                     ((pbVar9->m_positionWorldOnA).m_floats[0] -
                     (pbVar9->m_normalWorldOnB).m_floats[0] * fVar15),
           fVar11 = (pbVar9->m_positionWorldOnB).m_floats[1] -
                    ((pbVar9->m_positionWorldOnA).m_floats[1] -
                    (pbVar9->m_normalWorldOnB).m_floats[1] * fVar15),
           fVar15 = (pbVar9->m_positionWorldOnB).m_floats[2] -
                    ((pbVar9->m_positionWorldOnA).m_floats[2] -
                    fVar15 * (pbVar9->m_normalWorldOnB).m_floats[2]),
           fVar1 * fVar1 < fVar15 * fVar15 + fVar13 * fVar13 + fVar11 * fVar11)) {
          removeContactPoint(this,(int)uVar10 + -1);
        }
        else if (gContactProcessedCallback != (ContactProcessedCallback)0x0) {
          (*gContactProcessedCallback)(pbVar9,this->m_body0,this->m_body1);
        }
        pbVar9 = pbVar9 + -1;
        bVar4 = 1 < uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar4);
    }
  }
  return;
}

Assistant:

int btPersistentManifold::sortCachedPoints(const btManifoldPoint& pt) 
{
		//calculate 4 possible cases areas, and take biggest area
		//also need to keep 'deepest'
		
		int maxPenetrationIndex = -1;
#define KEEP_DEEPEST_POINT 1
#ifdef KEEP_DEEPEST_POINT
		btScalar maxPenetration = pt.getDistance();
		for (int i=0;i<4;i++)
		{
			if (m_pointCache[i].getDistance() < maxPenetration)
			{
				maxPenetrationIndex = i;
				maxPenetration = m_pointCache[i].getDistance();
			}
		}
#endif //KEEP_DEEPEST_POINT
		
		btScalar res0(btScalar(0.)),res1(btScalar(0.)),res2(btScalar(0.)),res3(btScalar(0.));

	if (gContactCalcArea3Points)
	{
		if (maxPenetrationIndex != 0)
		{
			btVector3 a0 = pt.m_localPointA-m_pointCache[1].m_localPointA;
			btVector3 b0 = m_pointCache[3].m_localPointA-m_pointCache[2].m_localPointA;
			btVector3 cross = a0.cross(b0);
			res0 = cross.length2();
		}
		if (maxPenetrationIndex != 1)
		{
			btVector3 a1 = pt.m_localPointA-m_pointCache[0].m_localPointA;
			btVector3 b1 = m_pointCache[3].m_localPointA-m_pointCache[2].m_localPointA;
			btVector3 cross = a1.cross(b1);
			res1 = cross.length2();
		}

		if (maxPenetrationIndex != 2)
		{
			btVector3 a2 = pt.m_localPointA-m_pointCache[0].m_localPointA;
			btVector3 b2 = m_pointCache[3].m_localPointA-m_pointCache[1].m_localPointA;
			btVector3 cross = a2.cross(b2);
			res2 = cross.length2();
		}

		if (maxPenetrationIndex != 3)
		{
			btVector3 a3 = pt.m_localPointA-m_pointCache[0].m_localPointA;
			btVector3 b3 = m_pointCache[2].m_localPointA-m_pointCache[1].m_localPointA;
			btVector3 cross = a3.cross(b3);
			res3 = cross.length2();
		}
	} 
	else
	{
		if(maxPenetrationIndex != 0) {
			res0 = calcArea4Points(pt.m_localPointA,m_pointCache[1].m_localPointA,m_pointCache[2].m_localPointA,m_pointCache[3].m_localPointA);
		}

		if(maxPenetrationIndex != 1) {
			res1 = calcArea4Points(pt.m_localPointA,m_pointCache[0].m_localPointA,m_pointCache[2].m_localPointA,m_pointCache[3].m_localPointA);
		}

		if(maxPenetrationIndex != 2) {
			res2 = calcArea4Points(pt.m_localPointA,m_pointCache[0].m_localPointA,m_pointCache[1].m_localPointA,m_pointCache[3].m_localPointA);
		}

		if(maxPenetrationIndex != 3) {
			res3 = calcArea4Points(pt.m_localPointA,m_pointCache[0].m_localPointA,m_pointCache[1].m_localPointA,m_pointCache[2].m_localPointA);
		}
	}
	btVector4 maxvec(res0,res1,res2,res3);
	int biggestarea = maxvec.closestAxis4();
	return biggestarea;
	
}